

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O1

void __thiscall
test_vector_dense_scalar_multiplication_Test::TestBody
          (test_vector_dense_scalar_multiplication_Test *this)

{
  pointer pdVar1;
  pointer pdVar2;
  double *element;
  double *pdVar3;
  long lVar4;
  Vector_Dense<double,_2UL> *__range2;
  char *pcVar5;
  AssertionResult gtest_ar;
  Vector_Dense<double,_0UL> dynamic_vector;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  pointer local_78;
  AssertHelper local_68;
  undefined8 local_60;
  initializer_list<double> local_58;
  AssertHelper local_48;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> local_28;
  
  local_58._M_array = (iterator)local_88;
  local_88 = (undefined1  [8])0x3ff0000000000000;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x4000000000000000;
  local_78 = (pointer)&DAT_4008000000000000;
  local_58._M_len = 3;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)&local_40,&local_58);
  std::vector<double,_std::allocator<double>_>::vector(&local_28,&local_40);
  for (pdVar3 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 != local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
    *pdVar3 = *pdVar3 * -3.0;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,&local_28);
  pdVar2 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar1 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_88;
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pbStack_80;
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_78;
  local_88 = (undefined1  [8])0x0;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78 = (pointer)0x0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
  }
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88,(long)local_78 - (long)local_88);
  }
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"dynamic_vector[0]","-3.0",
             *local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,-3.0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58._M_array != (pointer)0x0) {
      (**(code **)((long)*local_58._M_array + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"dynamic_vector[1]","-6.0",
             local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1],-6.0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58._M_array != (pointer)0x0) {
      (**(code **)((long)*local_58._M_array + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"dynamic_vector[2]","-9.0",
             local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2],-9.0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58._M_array != (pointer)0x0) {
      (**(code **)((long)*local_58._M_array + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_88 = (undefined1  [8])&local_68;
  local_68.data_ = (AssertHelperData *)&DAT_4008000000000000;
  local_60 = 0xc014000000000000;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)&local_58,(initializer_list<double> *)local_88);
  local_88 = (undefined1  [8])local_58._M_array;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_len;
  lVar4 = 0;
  do {
    *(double *)(local_88 + lVar4) = *(double *)(local_88 + lVar4) * 4.0;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  local_58._M_array = (iterator)local_88;
  local_58._M_len = (size_type)pbStack_80;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"static_vector[0]","12.0",(double)local_88,12.0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xa3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"static_vector[1]","-20.0",(double)local_58._M_len,-20.0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xa4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(test_vector_dense, scalar_multiplication) {
  Vector_Dense<Scalar, 0> dynamic_vector = {1.0, 2.0, 3.0};
  dynamic_vector = -3.0 * dynamic_vector;
  EXPECT_DOUBLE_EQ(dynamic_vector[0], -3.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], -6.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], -9.0);

  Vector_Dense<Scalar, 2> static_vector = {3.0, -5.0};
  static_vector = 4.0 * static_vector;
  EXPECT_DOUBLE_EQ(static_vector[0], 12.0);
  EXPECT_DOUBLE_EQ(static_vector[1], -20.0);
}